

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xml_parse_file_ext2(xar *xar,char *name)

{
  int iVar1;
  char *local_28;
  char *flag;
  char *name_local;
  xar *xar_local;
  
  local_28 = (char *)0x0;
  iVar1 = strcmp(name,"SecureDeletion");
  if (iVar1 == 0) {
    xar->xmlsts = FILE_EXT2_SecureDeletion;
    local_28 = "securedeletion";
  }
  else {
    iVar1 = strcmp(name,"Undelete");
    if (iVar1 == 0) {
      xar->xmlsts = FILE_EXT2_Undelete;
      local_28 = "nouunlink";
    }
    else {
      iVar1 = strcmp(name,"Compress");
      if (iVar1 == 0) {
        xar->xmlsts = FILE_EXT2_Compress;
        local_28 = "compress";
      }
      else {
        iVar1 = strcmp(name,"Synchronous");
        if (iVar1 == 0) {
          xar->xmlsts = FILE_EXT2_Synchronous;
          local_28 = "sync";
        }
        else {
          iVar1 = strcmp(name,"Immutable");
          if (iVar1 == 0) {
            xar->xmlsts = FILE_EXT2_Immutable;
            local_28 = "simmutable";
          }
          else {
            iVar1 = strcmp(name,"AppendOnly");
            if (iVar1 == 0) {
              xar->xmlsts = FILE_EXT2_AppendOnly;
              local_28 = "sappend";
            }
            else {
              iVar1 = strcmp(name,"NoDump");
              if (iVar1 == 0) {
                xar->xmlsts = FILE_EXT2_NoDump;
                local_28 = "nodump";
              }
              else {
                iVar1 = strcmp(name,"NoAtime");
                if (iVar1 == 0) {
                  xar->xmlsts = FILE_EXT2_NoAtime;
                  local_28 = "noatime";
                }
                else {
                  iVar1 = strcmp(name,"CompDirty");
                  if (iVar1 == 0) {
                    xar->xmlsts = FILE_EXT2_CompDirty;
                    local_28 = "compdirty";
                  }
                  else {
                    iVar1 = strcmp(name,"CompBlock");
                    if (iVar1 == 0) {
                      xar->xmlsts = FILE_EXT2_CompBlock;
                      local_28 = "comprblk";
                    }
                    else {
                      iVar1 = strcmp(name,"NoCompBlock");
                      if (iVar1 == 0) {
                        xar->xmlsts = FILE_EXT2_NoCompBlock;
                        local_28 = "nocomprblk";
                      }
                      else {
                        iVar1 = strcmp(name,"CompError");
                        if (iVar1 == 0) {
                          xar->xmlsts = FILE_EXT2_CompError;
                          local_28 = "comperr";
                        }
                        else {
                          iVar1 = strcmp(name,"BTree");
                          if (iVar1 == 0) {
                            xar->xmlsts = FILE_EXT2_BTree;
                            local_28 = "btree";
                          }
                          else {
                            iVar1 = strcmp(name,"HashIndexed");
                            if (iVar1 == 0) {
                              xar->xmlsts = FILE_EXT2_HashIndexed;
                              local_28 = "hashidx";
                            }
                            else {
                              iVar1 = strcmp(name,"iMagic");
                              if (iVar1 == 0) {
                                xar->xmlsts = FILE_EXT2_iMagic;
                                local_28 = "imagic";
                              }
                              else {
                                iVar1 = strcmp(name,"Journaled");
                                if (iVar1 == 0) {
                                  xar->xmlsts = FILE_EXT2_Journaled;
                                  local_28 = "journal";
                                }
                                else {
                                  iVar1 = strcmp(name,"NoTail");
                                  if (iVar1 == 0) {
                                    xar->xmlsts = FILE_EXT2_NoTail;
                                    local_28 = "notail";
                                  }
                                  else {
                                    iVar1 = strcmp(name,"DirSync");
                                    if (iVar1 == 0) {
                                      xar->xmlsts = FILE_EXT2_DirSync;
                                      local_28 = "dirsync";
                                    }
                                    else {
                                      iVar1 = strcmp(name,"TopDir");
                                      if (iVar1 == 0) {
                                        xar->xmlsts = FILE_EXT2_TopDir;
                                        local_28 = "topdir";
                                      }
                                      else {
                                        iVar1 = strcmp(name,"Reserved");
                                        if (iVar1 == 0) {
                                          xar->xmlsts = FILE_EXT2_Reserved;
                                          local_28 = "reserved";
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_28 == (char *)0x0) {
    xar_local._4_4_ = 0;
  }
  else {
    if ((xar->file->fflags_text).length != 0) {
      archive_strappend_char(&xar->file->fflags_text,',');
    }
    archive_strcat(&xar->file->fflags_text,local_28);
    xar_local._4_4_ = 1;
  }
  return xar_local._4_4_;
}

Assistant:

static int
xml_parse_file_ext2(struct xar *xar, const char *name)
{
	const char *flag = NULL;

	if (strcmp(name, "SecureDeletion") == 0) {
		xar->xmlsts = FILE_EXT2_SecureDeletion;
		flag = "securedeletion";
	}
	else if (strcmp(name, "Undelete") == 0) {
		xar->xmlsts = FILE_EXT2_Undelete;
		flag = "nouunlink";
	}
	else if (strcmp(name, "Compress") == 0) {
		xar->xmlsts = FILE_EXT2_Compress;
		flag = "compress";
	}
	else if (strcmp(name, "Synchronous") == 0) {
		xar->xmlsts = FILE_EXT2_Synchronous;
		flag = "sync";
	}
	else if (strcmp(name, "Immutable") == 0) {
		xar->xmlsts = FILE_EXT2_Immutable;
		flag = "simmutable";
	}
	else if (strcmp(name, "AppendOnly") == 0) {
		xar->xmlsts = FILE_EXT2_AppendOnly;
		flag = "sappend";
	}
	else if (strcmp(name, "NoDump") == 0) {
		xar->xmlsts = FILE_EXT2_NoDump;
		flag = "nodump";
	}
	else if (strcmp(name, "NoAtime") == 0) {
		xar->xmlsts = FILE_EXT2_NoAtime;
		flag = "noatime";
	}
	else if (strcmp(name, "CompDirty") == 0) {
		xar->xmlsts = FILE_EXT2_CompDirty;
		flag = "compdirty";
	}
	else if (strcmp(name, "CompBlock") == 0) {
		xar->xmlsts = FILE_EXT2_CompBlock;
		flag = "comprblk";
	}
	else if (strcmp(name, "NoCompBlock") == 0) {
		xar->xmlsts = FILE_EXT2_NoCompBlock;
		flag = "nocomprblk";
	}
	else if (strcmp(name, "CompError") == 0) {
		xar->xmlsts = FILE_EXT2_CompError;
		flag = "comperr";
	}
	else if (strcmp(name, "BTree") == 0) {
		xar->xmlsts = FILE_EXT2_BTree;
		flag = "btree";
	}
	else if (strcmp(name, "HashIndexed") == 0) {
		xar->xmlsts = FILE_EXT2_HashIndexed;
		flag = "hashidx";
	}
	else if (strcmp(name, "iMagic") == 0) {
		xar->xmlsts = FILE_EXT2_iMagic;
		flag = "imagic";
	}
	else if (strcmp(name, "Journaled") == 0) {
		xar->xmlsts = FILE_EXT2_Journaled;
		flag = "journal";
	}
	else if (strcmp(name, "NoTail") == 0) {
		xar->xmlsts = FILE_EXT2_NoTail;
		flag = "notail";
	}
	else if (strcmp(name, "DirSync") == 0) {
		xar->xmlsts = FILE_EXT2_DirSync;
		flag = "dirsync";
	}
	else if (strcmp(name, "TopDir") == 0) {
		xar->xmlsts = FILE_EXT2_TopDir;
		flag = "topdir";
	}
	else if (strcmp(name, "Reserved") == 0) {
		xar->xmlsts = FILE_EXT2_Reserved;
		flag = "reserved";
	}

	if (flag == NULL)
		return (0);
	if (archive_strlen(&(xar->file->fflags_text)) > 0)
		archive_strappend_char(&(xar->file->fflags_text), ',');
	archive_strcat(&(xar->file->fflags_text), flag);
	return (1);
}